

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O1

void mread(memfile *mf,void *buf,uint len)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = mf->len - mf->pos;
  uVar1 = len;
  if (uVar2 < len) {
    uVar1 = uVar2;
  }
  memcpy(buf,mf->buf + mf->pos,(long)(int)uVar1);
  mf->pos = mf->pos + uVar1;
  if (uVar2 < len) {
    panic("Error reading game data.");
  }
  return;
}

Assistant:

void mread(struct memfile *mf, void *buf, unsigned int len)
{
	int rlen = min(len, mf->len - mf->pos);

	memcpy(buf, &mf->buf[mf->pos], rlen);
	mf->pos += rlen;
	if ((unsigned)rlen != len)
	    panic("Error reading game data.");
}